

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GateTypes.cpp
# Opt level: O0

void slang::ast::builtins::registerGateTypes(Compilation *c)

{
  initializer_list<slang::ast::PrimitivePortDirection> portDirs;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_00;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_01;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_02;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_03;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_04;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_05;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_06;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_07;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_08;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_09;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_10;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_11;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_12;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_13;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_14;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_15;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_16;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_17;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_18;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_19;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_20;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_21;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_22;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_23;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_24;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  Compilation *in_RDI;
  char *in_stack_fffffffffffffab8;
  Compilation *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffac0;
  Compilation *this;
  undefined8 in_stack_fffffffffffffb58;
  Compilation *pCVar1;
  PrimitiveKind PVar2;
  Compilation *in_stack_fffffffffffffb60;
  iterator in_stack_fffffffffffffb68;
  Compilation *pCVar3;
  size_type in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  char *in_stack_fffffffffffffb80;
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 *local_458;
  undefined8 local_450;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 *local_430;
  undefined8 local_428;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 *local_408;
  undefined8 local_400;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 *local_3e0;
  undefined8 local_3d8;
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 *local_3b8;
  undefined8 local_3b0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 *local_390;
  undefined8 local_388;
  undefined4 local_370;
  undefined4 local_36c;
  undefined4 *local_368;
  undefined8 local_360;
  undefined4 local_344;
  undefined4 *local_340;
  undefined8 local_338;
  undefined4 local_31c;
  undefined4 *local_318;
  undefined8 local_310;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 *local_2f0;
  undefined8 local_2e8;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 *local_2c8;
  undefined8 local_2c0;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 *local_298;
  undefined8 local_290;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 *local_268;
  undefined8 local_260;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 *local_238;
  undefined8 local_230;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 *local_208;
  undefined8 local_200;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 *local_1d8;
  undefined8 local_1d0;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 *local_1a8;
  undefined8 local_1a0;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 *local_178;
  undefined8 local_170;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 *local_148;
  undefined8 local_140;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 *local_118;
  undefined8 local_110;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 *local_e8;
  undefined8 local_e0;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 *local_b8;
  undefined8 local_b0;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 *local_88;
  undefined8 local_80;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined8 local_50;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 *local_28;
  undefined8 local_20;
  Compilation *local_8;
  
  PVar2 = (PrimitiveKind)((ulong)in_stack_fffffffffffffb58 >> 0x20);
  local_8 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  local_38 = 1;
  local_34 = 0;
  local_30 = 0;
  local_2c = 0;
  local_28 = &local_38;
  local_20 = 4;
  name._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name._M_len._0_4_ = in_stack_fffffffffffffb78;
  name._M_str = in_stack_fffffffffffffb80;
  portDirs._M_len = in_stack_fffffffffffffb70;
  portDirs._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name,portDirs,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  local_68 = 1;
  local_64 = 0;
  local_60 = 0;
  local_5c = 0;
  local_58 = &local_68;
  local_50 = 4;
  name_00._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_00._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_00._M_str = in_stack_fffffffffffffb80;
  portDirs_00._M_len = in_stack_fffffffffffffb70;
  portDirs_00._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_00,portDirs_00,PVar2);
  __str = local_8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffac0,(char *)local_8);
  local_94 = 1;
  local_90 = 0;
  local_8c = 0;
  local_88 = &local_94;
  local_80 = 3;
  name_01._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_01._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_01._M_str = in_stack_fffffffffffffb80;
  portDirs_01._M_len = in_stack_fffffffffffffb70;
  portDirs_01._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_01,portDirs_01,PVar2);
  this = local_8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_8,(char *)__str);
  local_c4 = 1;
  local_c0 = 0;
  local_bc = 0;
  local_b8 = &local_c4;
  local_b0 = 3;
  name_02._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_02._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_02._M_str = in_stack_fffffffffffffb80;
  portDirs_02._M_len = in_stack_fffffffffffffb70;
  portDirs_02._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_02,portDirs_02,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_f4 = 1;
  local_f0 = 0;
  local_ec = 0;
  local_e8 = &local_f4;
  local_e0 = 3;
  name_03._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_03._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_03._M_str = in_stack_fffffffffffffb80;
  portDirs_03._M_len = in_stack_fffffffffffffb70;
  portDirs_03._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_03,portDirs_03,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_124 = 1;
  local_120 = 0;
  local_11c = 0;
  local_118 = &local_124;
  local_110 = 3;
  name_04._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_04._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_04._M_str = in_stack_fffffffffffffb80;
  portDirs_04._M_len = in_stack_fffffffffffffb70;
  portDirs_04._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_04,portDirs_04,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_154 = 1;
  local_150 = 0;
  local_14c = 0;
  local_148 = &local_154;
  local_140 = 3;
  name_05._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_05._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_05._M_str = in_stack_fffffffffffffb80;
  portDirs_05._M_len = in_stack_fffffffffffffb70;
  portDirs_05._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_05,portDirs_05,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_184 = 1;
  local_180 = 0;
  local_17c = 0;
  local_178 = &local_184;
  local_170 = 3;
  name_06._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_06._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_06._M_str = in_stack_fffffffffffffb80;
  portDirs_06._M_len = in_stack_fffffffffffffb70;
  portDirs_06._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_06,portDirs_06,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_1b4 = 1;
  local_1b0 = 0;
  local_1ac = 0;
  local_1a8 = &local_1b4;
  local_1a0 = 3;
  name_07._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_07._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_07._M_str = in_stack_fffffffffffffb80;
  portDirs_07._M_len = in_stack_fffffffffffffb70;
  portDirs_07._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_07,portDirs_07,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_1e4 = 1;
  local_1e0 = 0;
  local_1dc = 0;
  local_1d8 = &local_1e4;
  local_1d0 = 3;
  name_08._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_08._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_08._M_str = in_stack_fffffffffffffb80;
  portDirs_08._M_len = in_stack_fffffffffffffb70;
  portDirs_08._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_08,portDirs_08,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_214 = 3;
  local_210 = 3;
  local_20c = 0;
  local_208 = &local_214;
  local_200 = 3;
  name_09._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_09._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_09._M_str = in_stack_fffffffffffffb80;
  portDirs_09._M_len = in_stack_fffffffffffffb70;
  portDirs_09._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_09,portDirs_09,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_244 = 3;
  local_240 = 3;
  local_23c = 0;
  local_238 = &local_244;
  local_230 = 3;
  name_10._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_10._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_10._M_str = in_stack_fffffffffffffb80;
  portDirs_10._M_len = in_stack_fffffffffffffb70;
  portDirs_10._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_10,portDirs_10,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_274 = 3;
  local_270 = 3;
  local_26c = 0;
  local_268 = &local_274;
  local_260 = 3;
  name_11._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_11._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_11._M_str = in_stack_fffffffffffffb80;
  portDirs_11._M_len = in_stack_fffffffffffffb70;
  portDirs_11._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_11,portDirs_11,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_2a4 = 3;
  local_2a0 = 3;
  local_29c = 0;
  local_298 = &local_2a4;
  local_290 = 3;
  name_12._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_12._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_12._M_str = in_stack_fffffffffffffb80;
  portDirs_12._M_len = in_stack_fffffffffffffb70;
  portDirs_12._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_12,portDirs_12,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_2d0 = 3;
  local_2cc = 3;
  local_2c8 = &local_2d0;
  local_2c0 = 2;
  name_13._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_13._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_13._M_str = in_stack_fffffffffffffb80;
  portDirs_13._M_len = in_stack_fffffffffffffb70;
  portDirs_13._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_13,portDirs_13,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_2f8 = 3;
  local_2f4 = 3;
  local_2f0 = &local_2f8;
  local_2e8 = 2;
  name_14._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_14._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_14._M_str = in_stack_fffffffffffffb80;
  portDirs_14._M_len = in_stack_fffffffffffffb70;
  portDirs_14._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_14,portDirs_14,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_31c = 1;
  local_318 = &local_31c;
  local_310 = 1;
  name_15._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_15._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_15._M_str = in_stack_fffffffffffffb80;
  portDirs_15._M_len = in_stack_fffffffffffffb70;
  portDirs_15._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_15,portDirs_15,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_344 = 1;
  local_340 = &local_344;
  local_338 = 1;
  name_16._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_16._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_16._M_str = in_stack_fffffffffffffb80;
  portDirs_16._M_len = in_stack_fffffffffffffb70;
  portDirs_16._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_16,portDirs_16,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_370 = 1;
  local_36c = 0;
  local_368 = &local_370;
  local_360 = 2;
  name_17._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_17._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_17._M_str = in_stack_fffffffffffffb80;
  portDirs_17._M_len = in_stack_fffffffffffffb70;
  portDirs_17._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_17,portDirs_17,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_398 = 1;
  local_394 = 0;
  local_390 = &local_398;
  local_388 = 2;
  name_18._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_18._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_18._M_str = in_stack_fffffffffffffb80;
  portDirs_18._M_len = in_stack_fffffffffffffb70;
  portDirs_18._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_18,portDirs_18,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_3c0 = 1;
  local_3bc = 0;
  local_3b8 = &local_3c0;
  local_3b0 = 2;
  name_19._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_19._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_19._M_str = in_stack_fffffffffffffb80;
  portDirs_19._M_len = in_stack_fffffffffffffb70;
  portDirs_19._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_19,portDirs_19,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_3e8 = 1;
  local_3e4 = 0;
  local_3e0 = &local_3e8;
  local_3d8 = 2;
  name_20._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_20._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_20._M_str = in_stack_fffffffffffffb80;
  portDirs_20._M_len = in_stack_fffffffffffffb70;
  portDirs_20._M_array = in_stack_fffffffffffffb68;
  gate(in_stack_fffffffffffffb60,name_20,portDirs_20,PVar2);
  pCVar1 = local_8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_410 = 1;
  local_40c = 0;
  local_408 = &local_410;
  local_400 = 2;
  name_21._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_21._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_21._M_str = in_stack_fffffffffffffb80;
  portDirs_21._M_len = in_stack_fffffffffffffb70;
  portDirs_21._M_array = in_stack_fffffffffffffb68;
  PVar2 = (PrimitiveKind)((ulong)pCVar1 >> 0x20);
  gate(in_stack_fffffffffffffb60,name_21,portDirs_21,PVar2);
  pCVar1 = local_8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_438 = 1;
  local_434 = 0;
  local_430 = &local_438;
  local_428 = 2;
  name_22._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_22._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_22._M_str = in_stack_fffffffffffffb80;
  portDirs_22._M_len = in_stack_fffffffffffffb70;
  portDirs_22._M_array = in_stack_fffffffffffffb68;
  gate(pCVar1,name_22,portDirs_22,PVar2);
  pCVar3 = local_8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  local_460 = 1;
  local_45c = 0;
  local_458 = &local_460;
  local_450 = 2;
  name_23._M_len._4_4_ = in_stack_fffffffffffffb7c;
  name_23._M_len._0_4_ = in_stack_fffffffffffffb78;
  name_23._M_str = in_stack_fffffffffffffb80;
  portDirs_23._M_len = in_stack_fffffffffffffb70;
  portDirs_23._M_array = (iterator)pCVar3;
  gate(pCVar1,name_23,portDirs_23,PVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)__str);
  name_24._M_str = &stack0xfffffffffffffb78;
  name_24._M_len = 1;
  portDirs_24._M_len = (size_type)local_8;
  portDirs_24._M_array = (iterator)pCVar3;
  gate(pCVar1,name_24,portDirs_24,PVar2);
  return;
}

Assistant:

void registerGateTypes(Compilation& c) {
    gate(c, "cmos", {out, in, in, in});
    gate(c, "rcmos", {out, in, in, in});
    gate(c, "bufif0", {out, in, in});
    gate(c, "bufif1", {out, in, in});
    gate(c, "notif0", {out, in, in});
    gate(c, "notif1", {out, in, in});
    gate(c, "nmos", {out, in, in});
    gate(c, "pmos", {out, in, in});
    gate(c, "rnmos", {out, in, in});
    gate(c, "rpmos", {out, in, in});
    gate(c, "tranif0", {inout, inout, in}, PrimitiveSymbol::BiDiSwitch);
    gate(c, "tranif1", {inout, inout, in}, PrimitiveSymbol::BiDiSwitch);
    gate(c, "rtranif0", {inout, inout, in});
    gate(c, "rtranif1", {inout, inout, in});
    gate(c, "tran", {inout, inout}, PrimitiveSymbol::BiDiSwitch);
    gate(c, "rtran", {inout, inout});
    gate(c, "pullup", {out});
    gate(c, "pulldown", {out});

    // These are special in that they support an arbitrary number of
    // either inputs or outputs.
    gate(c, "and", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "or", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "nand", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "nor", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "xor", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "xnor", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "buf", {out, in}, PrimitiveSymbol::NOutput);
    gate(c, "not", {out, in}, PrimitiveSymbol::NOutput);
}